

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

double __thiscall
CGL::GLScene::Mesh::triangle_selection_test_4d
          (Mesh *this,Vector2D *p,Vector4D *A,Vector4D *B,Vector4D *C,Vector3D *baryPtr)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float bV;
  float bU;
  float local_60;
  float local_5c;
  Vector2D local_58;
  Vector2D local_48;
  Vector2D local_38;
  
  local_38.x = (A->field_0).field_0.x;
  local_38.y = (A->field_0).field_0.y;
  local_48.x = (B->field_0).field_0.x;
  local_48.y = (B->field_0).field_0.y;
  local_58.x = (C->field_0).field_0.x;
  local_58.y = (C->field_0).field_0.y;
  bVar1 = triangle_selection_test_2d(this,p,&local_38,&local_48,&local_58,&local_5c,&local_60);
  if (bVar1) {
    dVar2 = (double)local_5c;
    dVar4 = (double)local_60;
    (baryPtr->field_0).field_0.x = (1.0 - dVar2) - dVar4;
    (baryPtr->field_0).field_0.y = dVar4;
    (baryPtr->field_0).field_0.z = dVar2;
    dVar3 = (A->field_0).field_0.w;
    dVar3 = ((B->field_0).field_0.w - dVar3) * dVar4 +
            ((C->field_0).field_0.w - dVar3) * dVar2 + dVar3;
  }
  else {
    dVar3 = -1.0;
  }
  return dVar3;
}

Assistant:

double Mesh::triangle_selection_test_4d(const Vector2D& p, const Vector4D& A,
                                        const Vector4D& B, const Vector4D& C,
                                        Vector3D *baryPtr) {
  Vector2D a2D(A.x, A.y);
  Vector2D b2D(B.x, B.y);
  Vector2D c2D(C.x, C.y);
  float bU, bV;

  if (triangle_selection_test_2d(p, a2D, b2D, c2D, &bU, &bV)) {
    baryPtr->x = 1.0 - bU - bV;
    baryPtr->y = bV;
    baryPtr->z = bU;
    return A.w + (C.w - A.w) * bU + (B.w - A.w) * bV;
  }
  return -1.0;
}